

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O2

int colamd(int n_row,int n_col,int Alen,int *A,int *p,double *knobs,int *stats)

{
  anon_union_4_2_34273927_for_shared1 *Row;
  double dVar1;
  anon_union_4_2_34273927_for_shared1 aVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  anon_union_4_2_34273927_for_shared1 *paVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  anon_union_4_2_34273927_for_shared1 *paVar19;
  int *piVar20;
  int *piVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  uint *puVar32;
  int *piVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  anon_union_4_2_34273927_for_shared1 *paVar38;
  ulong uVar39;
  ulong uVar40;
  int *piVar41;
  ulong uVar42;
  int iVar43;
  bool bVar44;
  double dVar45;
  uint local_1a4;
  int local_194;
  int local_184;
  int local_158;
  int local_154;
  int local_140;
  uint local_ec;
  long local_e8;
  int *local_e0;
  double default_knobs [20];
  
  if (stats != (int *)0x0) {
    uVar40 = (ulong)(uint)n_row;
    uVar42 = (ulong)(uint)n_col;
    for (lVar8 = 0; lVar8 != 0x14; lVar8 = lVar8 + 1) {
      stats[lVar8] = 0;
    }
    stats[3] = 0;
    stats[4] = -1;
    stats[5] = -1;
    if (A == (int *)0x0) {
      stats[3] = -1;
    }
    else if (p == (int *)0x0) {
      stats[3] = -2;
    }
    else if (n_row < 0) {
      stats[3] = -3;
      stats[4] = n_row;
    }
    else if (n_col < 0) {
      stats[3] = -4;
      stats[4] = n_col;
    }
    else {
      local_194 = p[uVar42];
      if ((long)local_194 < 0) {
        stats[3] = -5;
        stats[4] = local_194;
      }
      else {
        if (*p == 0) {
          if (knobs == (double *)0x0) {
            knobs = default_knobs;
            colamd_set_defaults(knobs);
          }
          dVar1 = knobs[2];
          local_ec = 1;
          sVar9 = t_mult(uVar42 + 1,0x18,(int *)&local_ec);
          uVar30 = n_row + 1;
          if (local_ec == 0) {
            uVar30 = 0;
          }
          local_ec = (uint)(local_ec != 0);
          sVar10 = t_mult((ulong)uVar30,0x10,(int *)&local_ec);
          sVar11 = t_mult((long)local_194,2,(int *)&local_ec);
          if (local_ec == 0) {
            uVar18 = 0;
          }
          else {
            uVar18 = sVar11 + uVar42;
            if (sVar11 <= uVar42) {
              sVar11 = uVar42;
            }
            if (sVar11 <= uVar18) {
              uVar37 = sVar9 >> 2;
              uVar22 = uVar18 + uVar37;
              if (uVar18 <= uVar37) {
                uVar18 = uVar37;
              }
              if (uVar18 <= uVar22) {
                uVar39 = sVar10 >> 2;
                uVar18 = uVar22 + uVar39;
                if (uVar22 <= uVar39) {
                  uVar22 = uVar39;
                }
                local_ec = (uint)(uVar22 <= uVar18);
                if (uVar22 <= uVar18) {
                  if (uVar18 <= (ulong)(long)Alen && (uVar18 & 0xffffffff80000000) == 0) {
                    iVar31 = Alen - ((int)uVar39 + (int)uVar37);
                    local_e8 = (long)iVar31;
                    piVar17 = A + local_e8;
                    Row = (anon_union_4_2_34273927_for_shared1 *)(piVar17 + uVar37);
                    piVar13 = A + local_e8 + 2;
                    for (uVar18 = 0; uVar42 != uVar18; uVar18 = uVar18 + 1) {
                      iVar27 = p[uVar18];
                      piVar13[-2] = iVar27;
                      iVar27 = p[uVar18 + 1] - iVar27;
                      piVar13[-1] = iVar27;
                      if (iVar27 < 0) {
                        stats[3] = -8;
                        stats[4] = (int)uVar18;
                        stats[5] = piVar13[-1];
                        return 0;
                      }
                      piVar13[0] = 1;
                      piVar13[1] = 0;
                      piVar13[2] = -1;
                      piVar13[3] = -1;
                      piVar13 = piVar13 + 6;
                    }
                    stats[6] = 0;
                    lVar8 = local_e8 * 4 + uVar37 * 4;
                    lVar5 = lVar8 + 0xc;
                    lVar25 = uVar40 << 4;
                    for (lVar12 = 0; lVar25 != lVar12; lVar12 = lVar12 + 0x10) {
                      *(undefined4 *)((long)A + lVar12 + lVar8 + 4) = 0;
                      *(undefined4 *)((long)A + lVar12 + lVar5) = 0xffffffff;
                    }
                    uVar18 = 0;
                    while (uVar22 = uVar18, uVar22 != uVar42) {
                      iVar27 = p[uVar22 + 1];
                      uVar30 = 0xffffffff;
                      for (puVar32 = (uint *)(A + p[uVar22]); uVar18 = uVar22 + 1,
                          puVar32 < A + iVar27; puVar32 = puVar32 + 1) {
                        uVar7 = *puVar32;
                        iVar23 = (int)uVar22;
                        if ((uint)n_row <= uVar7) {
                          stats[3] = -9;
                          stats[4] = iVar23;
                          stats[5] = uVar7;
                          stats[6] = n_row;
                          return 0;
                        }
                        uVar18 = (ulong)uVar7;
                        if (((int)uVar7 <= (int)uVar30) ||
                           (uVar39 = (ulong)*(uint *)(Row + uVar18 * 4 + 3), uVar22 == uVar39)) {
                          stats[3] = 1;
                          stats[4] = iVar23;
                          stats[5] = uVar7;
                          stats[6] = stats[6] + 1;
                          uVar39 = (ulong)*(uint *)(Row + uVar18 * 4 + 3);
                        }
                        piVar13 = piVar17 + uVar22 * 6;
                        if (uVar39 != uVar22) {
                          piVar13 = (int *)(Row + uVar18 * 4);
                        }
                        piVar13[1] = piVar13[1] + (uint)(uVar39 != uVar22) * 2 + -1;
                        Row[uVar18 * 4 + 3] = (anon_union_4_2_34273927_for_shared1)iVar23;
                        uVar30 = uVar7;
                      }
                    }
                    aVar2 = *(anon_union_4_2_34273927_for_shared1 *)(p + uVar42);
                    *Row = aVar2;
                    Row[2] = aVar2;
                    Row[3].degree = -1;
                    piVar13 = A + uVar37 + local_e8 + 7;
                    for (uVar18 = 1; uVar18 < uVar40; uVar18 = uVar18 + 1) {
                      piVar13[-3] = piVar13[-6] + piVar13[-7];
                      piVar13[-1] = piVar13[-6] + piVar13[-7];
                      *piVar13 = -1;
                      piVar13 = piVar13 + 4;
                    }
                    if (stats[3] == 1) {
                      uVar18 = 0;
                      while (uVar22 = uVar18, uVar22 != uVar42) {
                        piVar13 = A + p[uVar22];
                        iVar27 = p[uVar22 + 1];
                        while (uVar18 = uVar22 + 1, piVar13 < A + iVar27) {
                          lVar12 = (long)*piVar13;
                          piVar13 = piVar13 + 1;
                          if (uVar22 != (uint)Row[lVar12 * 4 + 3].degree) {
                            iVar23 = Row[lVar12 * 4 + 2].degree;
                            Row[lVar12 * 4 + 2].degree = iVar23 + 1;
                            A[iVar23] = (int)uVar22;
                            Row[lVar12 * 4 + 3].degree = (int)uVar22;
                          }
                        }
                      }
                    }
                    else {
                      uVar18 = 0;
                      while (uVar22 = uVar18, uVar22 != uVar42) {
                        iVar27 = p[uVar22 + 1];
                        for (piVar13 = A + p[uVar22]; uVar18 = uVar22 + 1, piVar13 < A + iVar27;
                            piVar13 = piVar13 + 1) {
                          iVar23 = Row[(long)*piVar13 * 4 + 2].degree;
                          Row[(long)*piVar13 * 4 + 2].degree = iVar23 + 1;
                          A[iVar23] = (int)uVar22;
                        }
                      }
                    }
                    for (lVar12 = 0; lVar25 != lVar12; lVar12 = lVar12 + 0x10) {
                      *(undefined4 *)((long)A + lVar12 + lVar5) = 0;
                      *(undefined4 *)((long)A + lVar12 + lVar8 + 8) =
                           *(undefined4 *)((long)A + lVar12 + lVar8 + 4);
                    }
                    if (stats[3] == 1) {
                      *piVar17 = 0;
                      *p = 0;
                      piVar13 = piVar17;
                      for (uVar18 = 1; uVar18 < uVar42; uVar18 = uVar18 + 1) {
                        piVar14 = piVar13 + 1;
                        iVar27 = *piVar13;
                        piVar13[6] = *piVar14 + iVar27;
                        piVar13 = piVar13 + 6;
                        p[uVar18] = *piVar14 + iVar27;
                      }
                      for (uVar18 = 0; uVar18 != uVar40; uVar18 = uVar18 + 1) {
                        piVar13 = A + Row[uVar18 * 4].degree;
                        piVar14 = piVar13 + Row[uVar18 * 4 + 1].degree;
                        for (; piVar13 < piVar14; piVar13 = piVar13 + 1) {
                          iVar27 = p[*piVar13];
                          p[*piVar13] = iVar27 + 1;
                          A[iVar27] = (int)uVar18;
                        }
                      }
                    }
                    if (0.0 <= *knobs) {
                      dVar45 = SQRT((double)n_col) * *knobs;
                      if (16.0 <= dVar45) {
                        iVar27 = (int)dVar45;
                      }
                      else {
                        iVar27 = 0x10;
                      }
                    }
                    else {
                      iVar27 = n_col + -1;
                    }
                    if (0.0 <= knobs[1]) {
                      iVar23 = n_col;
                      if (n_row < n_col) {
                        iVar23 = n_row;
                      }
                      dVar45 = SQRT((double)iVar23) * knobs[1];
                      if (16.0 <= dVar45) {
                        iVar23 = (int)dVar45;
                      }
                      else {
                        iVar23 = 0x10;
                      }
                    }
                    else {
                      iVar23 = n_row + -1;
                    }
                    uVar7 = n_col - 1;
                    local_1a4 = n_col;
                    for (uVar30 = uVar7; uVar28 = uVar7, -1 < (int)uVar30; uVar30 = uVar30 - 1) {
                      if (piVar17[(ulong)uVar30 * 6 + 1] == 0) {
                        local_1a4 = local_1a4 - 1;
                        (piVar17 + (ulong)uVar30 * 6)[3] = local_1a4;
                        piVar17[(ulong)uVar30 * 6] = -1;
                      }
                    }
                    for (; -1 < (int)uVar28; uVar28 = uVar28 - 1) {
                      iVar29 = piVar17[(ulong)uVar28 * 6];
                      if (-1 < (long)iVar29) {
                        piVar13 = piVar17 + (ulong)uVar28 * 6;
                        if (iVar23 < piVar13[1]) {
                          local_1a4 = local_1a4 - 1;
                          piVar13[3] = local_1a4;
                          piVar14 = A + iVar29;
                          piVar33 = piVar14 + piVar13[1];
                          for (; piVar14 < piVar33; piVar14 = piVar14 + 1) {
                            Row[(long)*piVar14 * 4 + 2].degree =
                                 Row[(long)*piVar14 * 4 + 2].degree + -1;
                          }
                          *piVar13 = -1;
                        }
                      }
                    }
                    iVar23 = 0;
                    for (lVar12 = 0; uVar30 = uVar7, lVar25 != lVar12; lVar12 = lVar12 + 0x10) {
                      iVar29 = *(int *)((long)A + lVar12 + lVar8 + 8);
                      if (iVar27 < iVar29 || iVar29 == 0) {
                        *(undefined4 *)((long)A + lVar12 + lVar5) = 0xffffffff;
                        uVar40 = (ulong)((int)uVar40 - 1);
                      }
                      else if (iVar23 <= iVar29) {
                        iVar23 = iVar29;
                      }
                    }
                    for (; -1 < (int)uVar30; uVar30 = uVar30 - 1) {
                      if (-1 < (long)piVar17[(ulong)uVar30 * 6]) {
                        puVar32 = (uint *)(piVar17 + (ulong)uVar30 * 6);
                        piVar13 = A + piVar17[(ulong)uVar30 * 6];
                        piVar14 = piVar13 + (int)puVar32[1];
                        piVar33 = piVar13;
                        uVar28 = 0;
                        while (piVar33 < piVar14) {
                          iVar27 = *piVar33;
                          piVar33 = piVar33 + 1;
                          if (-1 < Row[(long)iVar27 * 4 + 3].degree) {
                            *piVar13 = iVar27;
                            piVar13 = piVar13 + 1;
                            uVar28 = (uVar28 + Row[(long)iVar27 * 4 + 2].degree) - 1;
                            if (n_col <= (int)uVar28) {
                              uVar28 = n_col;
                            }
                          }
                        }
                        uVar35 = (uint)((ulong)((long)piVar13 - (long)(A + *puVar32)) >> 2);
                        if (uVar35 == 0) {
                          local_1a4 = local_1a4 - 1;
                          puVar32[3] = local_1a4;
                          *puVar32 = 0xffffffff;
                        }
                        else {
                          puVar32[1] = uVar35;
                          puVar32[3] = uVar28;
                        }
                      }
                    }
                    for (sVar9 = 0; uVar42 + 1 != sVar9; sVar9 = sVar9 + 1) {
                      p[sVar9] = -1;
                    }
                    for (; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
                      uVar18 = (ulong)uVar7;
                      if (-1 < piVar17[uVar18 * 6]) {
                        iVar27 = piVar17[uVar18 * 6 + 3];
                        iVar29 = p[iVar27];
                        piVar17[uVar18 * 6 + 4] = -1;
                        piVar17[uVar18 * 6 + 5] = iVar29;
                        if ((long)iVar29 != -1) {
                          piVar17[(long)iVar29 * 6 + 4] = uVar7;
                        }
                        p[iVar27] = uVar7;
                      }
                    }
                    local_194 = local_194 * 2;
                    uVar7 = n_col ^ 0x7fffffff;
                    iVar27 = clear_mark(0,uVar7,n_row,(Colamd_Row *)Row);
                    local_154 = 0;
                    uVar30 = 0;
                    local_140 = 0;
                    do {
                      if ((int)local_1a4 <= (int)uVar30) {
                        for (uVar18 = 0; uVar18 != uVar42; uVar18 = uVar18 + 1) {
                          if ((piVar17[uVar18 * 6] != -1) && (piVar17[uVar18 * 6 + 3] == -1)) {
                            uVar22 = uVar18 & 0xffffffff;
                            do {
                              uVar30 = piVar17[(long)(int)uVar22 * 6 + 2];
                              uVar22 = (ulong)(int)uVar30;
                            } while (piVar17[uVar22 * 6] != -1);
                            iVar31 = piVar17[uVar22 * 6 + 3];
                            uVar37 = uVar18 & 0xffffffff;
                            do {
                              piVar17[(long)(int)uVar37 * 6 + 3] = iVar31;
                              iVar31 = iVar31 + 1;
                              piVar17[(long)(int)uVar37 * 6 + 2] = uVar30;
                              uVar37 = (ulong)uVar30;
                            } while (piVar17[uVar22 * 6 + 3] == -1);
                            piVar17[uVar22 * 6 + 3] = iVar31;
                          }
                        }
                        piVar17 = A + local_e8 + 3;
                        for (uVar18 = 0; uVar42 != uVar18; uVar18 = uVar18 + 1) {
                          p[*piVar17] = (int)uVar18;
                          piVar17 = piVar17 + 6;
                        }
                        *stats = n_row - (int)uVar40;
                        stats[1] = n_col - local_1a4;
                        stats[2] = local_140;
                        return 1;
                      }
                      iVar29 = local_154 + -1;
                      lVar12 = (long)local_154;
                      do {
                        lVar16 = lVar12;
                        iVar3 = p[lVar16];
                        iVar29 = iVar29 + 1;
                        if ((long)uVar42 <= lVar16) break;
                        lVar12 = lVar16 + 1;
                      } while (iVar3 == -1);
                      iVar43 = piVar17[(long)iVar3 * 6 + 5];
                      p[lVar16] = iVar43;
                      if ((long)iVar43 != -1) {
                        piVar17[(long)iVar43 * 6 + 4] = -1;
                      }
                      piVar13 = piVar17 + (long)iVar3 * 6;
                      iVar3 = piVar13[2];
                      iVar43 = piVar13[3];
                      piVar13[3] = uVar30;
                      uVar30 = uVar30 + iVar3;
                      iVar34 = n_col - uVar30;
                      if (iVar43 < (int)(n_col - uVar30)) {
                        iVar34 = iVar43;
                      }
                      iVar43 = local_194;
                      if (iVar31 <= iVar34 + local_194) {
                        paVar38 = (anon_union_4_2_34273927_for_shared1 *)A;
                        for (uVar18 = 0; uVar18 != uVar42; uVar18 = uVar18 + 1) {
                          iVar27 = piVar17[uVar18 * 6];
                          if (-1 < (long)iVar27) {
                            puVar32 = (uint *)(piVar17 + uVar18 * 6);
                            *puVar32 = (uint)((ulong)((long)paVar38 - (long)A) >> 2);
                            uVar28 = puVar32[1];
                            if ((int)uVar28 < 1) {
                              uVar28 = 0;
                            }
                            for (lVar12 = 0; uVar28 != (uint)lVar12; lVar12 = lVar12 + 1) {
                              if (-1 < Row[(long)A[iVar27 + lVar12] * 4 + 3].degree) {
                                paVar38->degree = A[iVar27 + lVar12];
                                paVar38 = paVar38 + 1;
                              }
                            }
                            puVar32[1] = (uint)((ulong)((long)paVar38 - (long)(A + *puVar32)) >> 2);
                          }
                        }
                        iVar27 = -1;
                        for (lVar12 = 0; lVar25 != lVar12; lVar12 = lVar12 + 0x10) {
                          if ((*(int *)((long)A + lVar12 + lVar5) < 0) ||
                             (*(int *)((long)A + lVar12 + lVar8 + 4) == 0)) {
                            *(undefined4 *)((long)A + lVar12 + lVar5) = 0xffffffff;
                          }
                          else {
                            iVar43 = *(int *)((long)A + lVar12 + lVar8);
                            *(int *)((long)A + lVar12 + lVar5) = A[iVar43];
                            A[iVar43] = iVar27;
                          }
                          iVar27 = iVar27 + -1;
                        }
                        paVar6 = paVar38;
                        while (paVar19 = paVar6,
                              paVar19 < (anon_union_4_2_34273927_for_shared1 *)(A + local_194)) {
                          paVar6 = paVar19 + 1;
                          if (paVar19->degree < 0) {
                            uVar18 = (ulong)(uint)~paVar19->degree;
                            *paVar19 = Row[uVar18 * 4 + 3];
                            Row[uVar18 * 4].degree = (int)((ulong)((long)paVar38 - (long)A) >> 2);
                            iVar27 = Row[uVar18 * 4 + 1].degree;
                            if (iVar27 < 1) {
                              iVar27 = 0;
                            }
                            while (bVar44 = iVar27 != 0, iVar27 = iVar27 + -1, bVar44) {
                              if (-1 < piVar17[(long)paVar19->degree * 6]) {
                                paVar38->degree = paVar19->degree;
                                paVar38 = paVar38 + 1;
                              }
                              paVar19 = paVar19 + 1;
                            }
                            (Row + uVar18 * 4)[1].degree =
                                 (int)((ulong)((long)paVar38 -
                                              (long)(A + (uint)Row[uVar18 * 4].degree)) >> 2);
                            paVar6 = paVar19;
                          }
                        }
                        local_140 = local_140 + 1;
                        iVar27 = clear_mark(0,uVar7,n_row,(Colamd_Row *)Row);
                        iVar43 = (int)((ulong)((long)paVar38 - (long)A) >> 2);
                      }
                      piVar13[2] = -iVar3;
                      piVar14 = A + *piVar13;
                      piVar33 = piVar14 + piVar13[1];
                      local_184 = 0;
                      local_194 = iVar43;
                      while (piVar14 < piVar33) {
                        iVar34 = *piVar14;
                        piVar14 = piVar14 + 1;
                        if (-1 < Row[(long)iVar34 * 4 + 3].degree) {
                          iVar24 = Row[(long)iVar34 * 4].degree;
                          iVar34 = (Row + (long)iVar34 * 4)[1].degree;
                          piVar15 = A + iVar24;
                          while (piVar21 = piVar15, piVar21 < A + iVar24 + iVar34) {
                            iVar26 = *piVar21;
                            iVar4 = piVar17[(long)iVar26 * 6 + 2];
                            piVar15 = piVar21 + 1;
                            if ((0 < iVar4) && (-1 < piVar17[(long)iVar26 * 6])) {
                              (piVar17 + (long)iVar26 * 6)[2] = -iVar4;
                              lVar12 = (long)local_194;
                              local_194 = local_194 + 1;
                              A[lVar12] = iVar26;
                              local_184 = local_184 + iVar4;
                              piVar15 = piVar21 + 1;
                            }
                          }
                        }
                      }
                      piVar13[2] = iVar3;
                      piVar14 = A + *piVar13;
                      piVar33 = piVar14 + piVar13[1];
                      for (; piVar14 < piVar33; piVar14 = piVar14 + 1) {
                        Row[(long)*piVar14 * 4 + 3].degree = -1;
                      }
                      if (iVar23 <= local_184) {
                        iVar23 = local_184;
                      }
                      local_158 = -1;
                      if (local_194 - iVar43 != 0 && iVar43 <= local_194) {
                        local_158 = A[*piVar13];
                      }
                      piVar14 = A + iVar43;
                      piVar33 = piVar14 + (local_194 - iVar43);
                      piVar15 = piVar14;
                      while (piVar21 = piVar14, piVar15 < piVar33) {
                        lVar12 = (long)*piVar15;
                        piVar21 = piVar17 + lVar12 * 6;
                        iVar3 = piVar17[lVar12 * 6 + 2];
                        iVar34 = piVar17[lVar12 * 6 + 5];
                        piVar17[lVar12 * 6 + 2] = -iVar3;
                        iVar24 = piVar17[lVar12 * 6 + 4];
                        if ((long)iVar24 == -1) {
                          piVar20 = p + piVar21[3];
                        }
                        else {
                          piVar20 = piVar17 + (long)iVar24 * 6 + 5;
                        }
                        *piVar20 = iVar34;
                        if (iVar34 != -1) {
                          piVar17[(long)iVar34 * 6 + 4] = iVar24;
                        }
                        piVar15 = piVar15 + 1;
                        piVar20 = A + *piVar21;
                        piVar21 = piVar20 + piVar21[1];
                        while (piVar20 < piVar21) {
                          lVar12 = (long)*piVar20;
                          piVar20 = piVar20 + 1;
                          if (-1 < Row[lVar12 * 4 + 3].degree) {
                            iVar34 = Row[lVar12 * 4 + 3].degree - iVar27;
                            if (iVar34 < 0) {
                              iVar34 = Row[lVar12 * 4 + 2].degree;
                            }
                            iVar34 = iVar34 + iVar3;
                            uVar28 = iVar34 + iVar27;
                            uVar35 = -(uint)(iVar34 == 0) | uVar28;
                            if (dVar1 != 0.0) {
                              uVar28 = uVar35;
                            }
                            if (NAN(dVar1)) {
                              uVar28 = uVar35;
                            }
                            Row[lVar12 * 4 + 3].degree = uVar28;
                          }
                        }
                      }
                      while (piVar15 = piVar14, piVar21 < piVar33) {
                        iVar3 = *piVar21;
                        lVar12 = (long)iVar3;
                        puVar32 = (uint *)(piVar17 + lVar12 * 6);
                        piVar15 = A + piVar17[lVar12 * 6];
                        piVar20 = piVar15 + piVar17[lVar12 * 6 + 1];
                        uVar35 = 0;
                        piVar41 = piVar15;
                        uVar28 = 0;
                        while (piVar41 < piVar20) {
                          iVar34 = *piVar41;
                          piVar41 = piVar41 + 1;
                          iVar24 = Row[(long)iVar34 * 4 + 3].degree;
                          if (-1 < iVar24) {
                            *piVar15 = iVar34;
                            piVar15 = piVar15 + 1;
                            uVar35 = uVar35 + iVar34;
                            uVar28 = (uVar28 - iVar27) + iVar24;
                            if (n_col <= (int)uVar28) {
                              uVar28 = n_col;
                            }
                          }
                        }
                        uVar36 = (uint)((ulong)((long)piVar15 - (long)(A + *puVar32)) >> 2);
                        puVar32[1] = uVar36;
                        if (uVar36 == 0) {
                          *puVar32 = 0xffffffff;
                          local_184 = local_184 - puVar32[2];
                          puVar32[3] = uVar30;
                          uVar30 = puVar32[2] + uVar30;
                          piVar21 = piVar21 + 1;
                        }
                        else {
                          puVar32[3] = uVar28;
                          uVar18 = (ulong)uVar35 % (ulong)(n_col + 1);
                          lVar12 = (long)p[uVar18];
                          if (lVar12 < 0) {
                            uVar28 = -p[uVar18] - 2;
                            p[uVar18] = -2 - iVar3;
                          }
                          else {
                            uVar28 = piVar17[lVar12 * 6 + 4];
                            piVar17[lVar12 * 6 + 4] = iVar3;
                          }
                          puVar32[5] = uVar28;
                          puVar32[4] = (uint)uVar18;
                          piVar21 = piVar21 + 1;
                        }
                      }
                      while (piVar15 < piVar33) {
                        iVar3 = *piVar15;
                        piVar15 = piVar15 + 1;
                        if (-1 < piVar17[(long)iVar3 * 6]) {
                          iVar34 = p[piVar17[(long)iVar3 * 6 + 4]];
                          lVar12 = (long)iVar34;
                          if (lVar12 < 0) {
                            iVar24 = -2 - iVar34;
                          }
                          else {
                            iVar24 = piVar17[lVar12 * 6 + 4];
                          }
                          local_e0 = p + piVar17[(long)iVar3 * 6 + 4];
                          while (iVar24 != -1) {
                            lVar16 = (long)iVar24;
                            piVar21 = piVar17 + lVar16 * 6;
                            piVar41 = piVar17 + lVar16 * 6 + 5;
                            uVar28 = piVar17[lVar16 * 6 + 1];
                            piVar20 = piVar41;
                            iVar3 = iVar24;
                            uVar35 = 0;
                            if (0 < (int)uVar28) {
                              uVar35 = uVar28;
                            }
                            while( true ) {
                              iVar26 = *piVar20;
                              lVar16 = (long)iVar26;
                              if (lVar16 == -1) break;
                              piVar20 = piVar17 + lVar16 * 6;
                              if ((piVar17[lVar16 * 6 + 1] == uVar28) && (piVar20[3] == piVar21[3]))
                              {
                                for (uVar18 = 0; uVar35 != (uint)uVar18; uVar18 = uVar18 + 1) {
                                  if (A[(long)*piVar21 + uVar18] != A[(long)*piVar20 + uVar18])
                                  goto LAB_0010bd5a;
                                }
                                uVar18 = (ulong)uVar35;
LAB_0010bd5a:
                                if ((uint)uVar18 == uVar28) {
                                  piVar21[2] = piVar21[2] + piVar20[2];
                                  piVar20[2] = iVar24;
                                  *piVar20 = -2;
                                  piVar20[3] = -1;
                                  piVar17[(long)iVar3 * 6 + 5] = piVar20[5];
                                  iVar26 = iVar3;
                                }
                              }
                              piVar20 = piVar20 + 5;
                              iVar3 = iVar26;
                            }
                            iVar24 = *piVar41;
                          }
                          piVar21 = local_e0;
                          if (-1 < iVar34) {
                            piVar21 = piVar17 + lVar12 * 6 + 4;
                          }
                          *piVar21 = -1;
                        }
                      }
                      *piVar13 = -1;
                      iVar27 = clear_mark(iVar27 + iVar23 + 1,uVar7,n_row,(Colamd_Row *)Row);
                      piVar13 = piVar14;
                      piVar15 = piVar14;
                      while (local_154 = iVar29, piVar13 < piVar33) {
                        iVar3 = *piVar13;
                        piVar13 = piVar13 + 1;
                        iVar29 = local_154;
                        if (-1 < piVar17[(long)iVar3 * 6]) {
                          piVar21 = piVar17 + (long)iVar3 * 6;
                          *piVar15 = iVar3;
                          iVar29 = piVar21[1];
                          piVar21[1] = iVar29 + 1;
                          A[(long)*piVar21 + (long)iVar29] = local_158;
                          iVar34 = n_col - (uVar30 + piVar21[2]);
                          iVar29 = (piVar21[3] + local_184) - piVar21[2];
                          if (iVar34 <= iVar29) {
                            iVar29 = iVar34;
                          }
                          piVar21[3] = iVar29;
                          iVar34 = p[iVar29];
                          piVar21[4] = -1;
                          piVar21[5] = iVar34;
                          if ((long)iVar34 != -1) {
                            piVar17[(long)iVar34 * 6 + 4] = iVar3;
                          }
                          piVar15 = piVar15 + 1;
                          p[iVar29] = iVar3;
                          if (local_154 < iVar29) {
                            iVar29 = local_154;
                          }
                        }
                      }
                      if (0 < local_184) {
                        lVar12 = (long)local_158;
                        Row[lVar12 * 4].degree = iVar43;
                        Row[lVar12 * 4 + 1].degree =
                             (int)((ulong)((long)piVar15 - (long)piVar14) >> 2);
                        Row[lVar12 * 4 + 2].degree = local_184;
                        Row[lVar12 * 4 + 3].degree = 0;
                      }
                    } while( true );
                  }
                  goto LAB_0010b12b;
                }
              }
            }
            uVar18 = 0;
          }
LAB_0010b12b:
          stats[3] = -7;
          stats[4] = (int)uVar18;
          stats[5] = Alen;
          return 0;
        }
        stats[3] = -6;
        stats[4] = *p;
      }
    }
  }
  return 0;
}

Assistant:

PUBLIC Int COLAMD_MAIN		/* returns TRUE if successful, FALSE otherwise*/
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows in A */
    Int n_col,			/* number of columns in A */
    Int Alen,			/* length of A */
    Int A [],			/* row indices of A */
    Int p [],			/* pointers to columns in A */
    double knobs [COLAMD_KNOBS],/* parameters (uses defaults if NULL) */
    Int stats [COLAMD_STATS]	/* output statistics and error codes */
)
{
    /* === Local variables ================================================== */

    Int i ;			/* loop index */
    Int nnz ;			/* nonzeros in A */
    size_t Row_size ;		/* size of Row [], in integers */
    size_t Col_size ;		/* size of Col [], in integers */
    size_t need ;		/* minimum required length of A */
    Colamd_Row *Row ;		/* pointer into A of Row [0..n_row] array */
    Colamd_Col *Col ;		/* pointer into A of Col [0..n_col] array */
    Int n_col2 ;		/* number of non-dense, non-empty columns */
    Int n_row2 ;		/* number of non-dense, non-empty rows */
    Int ngarbage ;		/* number of garbage collections performed */
    Int max_deg ;		/* maximum row degree */
    double default_knobs [COLAMD_KNOBS] ;	/* default knobs array */
    Int aggressive ;		/* do aggressive absorption */
    int ok ;

#ifndef NDEBUG
    colamd_get_debug ("colamd") ;
#endif /* NDEBUG */

    /* === Check the input arguments ======================================== */

    if (!stats)
    {
	DEBUG0 (("colamd: stats not present\n")) ;
	return (FALSE) ;
    }
    for (i = 0 ; i < COLAMD_STATS ; i++)
    {
	stats [i] = 0 ;
    }
    stats [COLAMD_STATUS] = COLAMD_OK ;
    stats [COLAMD_INFO1] = -1 ;
    stats [COLAMD_INFO2] = -1 ;

    if (!A)		/* A is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_A_not_present ;
	DEBUG0 (("colamd: A not present\n")) ;
	return (FALSE) ;
    }

    if (!p)		/* p is not present */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p_not_present ;
	DEBUG0 (("colamd: p not present\n")) ;
    	return (FALSE) ;
    }

    if (n_row < 0)	/* n_row must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nrow_negative ;
	stats [COLAMD_INFO1] = n_row ;
	DEBUG0 (("colamd: nrow negative %d\n", n_row)) ;
    	return (FALSE) ;
    }

    if (n_col < 0)	/* n_col must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_ncol_negative ;
	stats [COLAMD_INFO1] = n_col ;
	DEBUG0 (("colamd: ncol negative %d\n", n_col)) ;
    	return (FALSE) ;
    }

    nnz = p [n_col] ;
    if (nnz < 0)	/* nnz must be >= 0 */
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_nnz_negative ;
	stats [COLAMD_INFO1] = nnz ;
	DEBUG0 (("colamd: number of entries negative %d\n", nnz)) ;
	return (FALSE) ;
    }

    if (p [0] != 0)
    {
	stats [COLAMD_STATUS] = COLAMD_ERROR_p0_nonzero	;
	stats [COLAMD_INFO1] = p [0] ;
	DEBUG0 (("colamd: p[0] not zero %d\n", p [0])) ;
	return (FALSE) ;
    }

    /* === If no knobs, set default knobs =================================== */

    if (!knobs)
    {
	COLAMD_set_defaults (default_knobs) ;
	knobs = default_knobs ;
    }

    aggressive = (knobs [COLAMD_AGGRESSIVE] != FALSE) ;

    /* === Allocate the Row and Col arrays from array A ===================== */

    ok = TRUE ;
    Col_size = COLAMD_C (n_col, &ok) ;	    /* size of Col array of structs */
    Row_size = COLAMD_R (n_row, &ok) ;	    /* size of Row array of structs */

    /* need = 2*nnz + n_col + Col_size + Row_size ; */
    need = t_mult (nnz, 2, &ok) ;
    need = t_add (need, n_col, &ok) ;
    need = t_add (need, Col_size, &ok) ;
    need = t_add (need, Row_size, &ok) ;

    if (!ok || need > (size_t) Alen || need > Int_MAX)
    {
	/* not enough space in array A to perform the ordering */
	stats [COLAMD_STATUS] = COLAMD_ERROR_A_too_small ;
	stats [COLAMD_INFO1] = need ;
	stats [COLAMD_INFO2] = Alen ;
	DEBUG0 (("colamd: Need Alen >= %d, given only Alen = %d\n", need,Alen));
	return (FALSE) ;
    }

    Alen -= Col_size + Row_size ;
    Col = (Colamd_Col *) &A [Alen] ;
    Row = (Colamd_Row *) &A [Alen + Col_size] ;

    /* === Construct the row and column data structures ===================== */

    if (!init_rows_cols (n_row, n_col, Row, Col, A, p, stats))
    {
	/* input matrix is invalid */
	DEBUG0 (("colamd: Matrix invalid\n")) ;
	return (FALSE) ;
    }

    /* === Initialize scores, kill dense rows/columns ======================= */

    init_scoring (n_row, n_col, Row, Col, A, p, knobs,
	&n_row2, &n_col2, &max_deg) ;

    /* === Order the supercolumns =========================================== */

    ngarbage = find_ordering (n_row, n_col, Alen, Row, Col, A, p,
	n_col2, max_deg, 2*nnz, aggressive) ;

    /* === Order the non-principal columns ================================== */

    order_children (n_col, Col, p) ;

    /* === Return statistics in stats ======================================= */

    stats [COLAMD_DENSE_ROW] = n_row - n_row2 ;
    stats [COLAMD_DENSE_COL] = n_col - n_col2 ;
    stats [COLAMD_DEFRAG_COUNT] = ngarbage ;
    DEBUG0 (("colamd: done.\n")) ; 
    return (TRUE) ;
}